

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Real * MatrixGetElement(Real *__return_storage_ptr__,Matrix *a,uint32_t rows,uint32_t columns)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (((uint)a < *(uint *)__return_storage_ptr__) &&
     (rows < *(uint *)((long)__return_storage_ptr__ + 4))) {
    return (Real *)((ulong)(*(uint *)((long)__return_storage_ptr__ + 4) * (uint)a + rows) << 4);
  }
  iVar1 = fprintf(_stderr,"%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n",
                  "MatrixGetElement");
  return (Real *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Real MatrixGetElement(const Matrix *a, uint32_t rows, uint32_t columns) {
#ifndef NDEBUG
  if (a->rows <= rows || a->columns <= columns) {
    fprintf(stderr, "%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n", __FUNCTION_NAME__, rows, a->rows, columns, a->columns);
    return false;
  }
#endif
  return a->matrix[columns + a->columns * rows];
}